

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdtls_base.cpp
# Opt level: O2

void __thiscall QDtlsBasePrivate::clearDtlsError(QDtlsBasePrivate *this)

{
  this->errorCode = NoError;
  QString::clear(&this->errorDescription);
  return;
}

Assistant:

void QDtlsBasePrivate::clearDtlsError()
{
    errorCode = QDtlsError::NoError;
    errorDescription.clear();
}